

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DotOut.h
# Opt level: O0

ostream * Hpipe::dot_out<std::__cxx11::string>
                    (ostream *os,
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val,int lim)

{
  char *beg;
  ostream *poVar1;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream ss;
  int lim_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val_local;
  ostream *os_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,(string *)val);
  std::__cxx11::ostringstream::str();
  beg = (char *)std::__cxx11::string::c_str();
  poVar1 = dot_out(os,beg,lim);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return poVar1;
}

Assistant:

std::ostream &dot_out( std::ostream &os, const T &val, int lim = -1 ) {
    std::ostringstream ss;
    ss << val;
    return dot_out( os, ss.str().c_str(), lim );
}